

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,char *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_5UL> *param_5)

{
  CappedArray<char,_5UL> *params;
  CappedArray<char,_5UL> CVar1;
  char *local_60;
  undefined4 local_58;
  char cStack_54;
  StringPtr local_50;
  CappedArray<char,_5UL> local_40;
  undefined5 local_30;
  undefined3 local_2b;
  char acStack_28 [5];
  char *local_20;
  DebugComparison<signed_char,_signed_char> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_40 = tryToCharSequence<signed_char,kj::CappedArray<char,5ul>>(param_2);
  acStack_28 = local_40.content;
  local_30 = (undefined5)local_40.currentSize;
  local_2b = local_40.currentSize._5_3_;
  params = (CappedArray<char,_5UL> *)(local_20 + 8);
  CVar1 = tryToCharSequence<signed_char,kj::CappedArray<char,5ul>>(local_20 + 1);
  local_60 = (char *)CVar1.currentSize;
  local_50.content.ptr = local_60;
  local_58 = CVar1.content._0_4_;
  local_50.content.size_._0_4_ = local_58;
  cStack_54 = CVar1.content[4];
  local_50.content.size_._4_1_ = cStack_54;
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_30,params,&local_50,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}